

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O2

ChangeInfo *
capnp::compiler::anon_unknown_0::fieldUpgradeList
          (ChangeInfo *__return_storage_ptr__,Builder decl,uint *nextOrdinal,bool scopeHasUnion)

{
  bool bVar1;
  char (*in_RCX) [7];
  char *pcVar2;
  ChangeKind kind;
  SegmentBuilder *pSVar3;
  StringPtr description;
  Reader value;
  size_t sStack_140;
  Reader nameText;
  Reader local_128;
  Builder field;
  Builder type;
  StringPtr local_a0;
  Builder relativeName;
  Builder elementType;
  Builder typeParams;
  
  field._builder.data = decl._builder.data;
  field._builder.pointers = decl._builder.pointers;
  field._builder.dataSize = decl._builder.dataSize;
  field._builder.pointerCount = decl._builder.pointerCount;
  field._builder._38_2_ = decl._builder._38_2_;
  field._builder.segment = decl._builder.segment;
  field._builder.capTable = decl._builder.capTable;
  if (*(short *)((long)decl._builder.data + 0xc) == 1) {
    pcVar2 = "Upgrade primitive list to struct list, but it had a default value.";
    sStack_140 = 0x43;
  }
  else {
    Declaration::Field::Builder::getType(&type,&field);
    if (*type._builder.data == 9) {
      local_128._reader.dataSize = type._builder.dataSize;
      local_128._reader.pointerCount = type._builder.pointerCount;
      local_128._reader._38_2_ = type._builder._38_2_;
      local_128._reader.data = type._builder.data;
      local_128._reader.pointers = type._builder.pointers;
      local_128._reader.segment = &(type._builder.segment)->super_SegmentReader;
      local_128._reader.capTable = &(type._builder.capTable)->super_CapTableReader;
      Expression::Application::Builder::getParams
                ((Builder *)&typeParams.builder,(Builder *)&local_128);
      _::ListBuilder::getStructElement((StructBuilder *)&local_128,&typeParams.builder,0);
      Expression::Param::Builder::getValue(&elementType,(Builder *)&local_128);
      Expression::Builder::getRelativeName((Builder *)&relativeName._builder,&elementType);
      _::StructBuilder::asReader(&relativeName._builder);
      nameText = LocatedText::Reader::getValue(&local_128);
      local_128._reader.segment = (SegmentReader *)0x1d3f29;
      local_128._reader.capTable = (CapTableReader *)0xb;
      bVar1 = kj::StringPtr::operator==(&nameText.super_StringPtr,(StringPtr *)&local_128);
      if (bVar1) {
LAB_00169ac0:
        pcVar2 = "Upgrade primitive list to struct list, but it was already a struct list.";
      }
      else {
        local_a0.content.ptr = "Struct";
        local_a0.content.size_ = 7;
        bVar1 = kj::StringPtr::endsWith(&nameText.super_StringPtr,&local_a0);
        if (bVar1) goto LAB_00169ac0;
        local_128._reader.segment = (SegmentReader *)0x1d3f1f;
        local_128._reader.capTable = (CapTableReader *)0x5;
        bVar1 = kj::StringPtr::operator==(&nameText.super_StringPtr,(StringPtr *)&local_128);
        if (!bVar1) {
          kj::str<capnp::Text::Reader&,char_const(&)[7]>
                    ((String *)&local_128,(kj *)&nameText,(Reader *)0x1d4559,in_RCX);
          pSVar3 = (SegmentBuilder *)local_128._reader.segment;
          if (local_128._reader.capTable == (CapTableReader *)0x0) {
            pSVar3 = (SegmentBuilder *)0x1ebdf1;
          }
          value.super_StringPtr.content.size_ =
               (long)&(local_128._reader.capTable)->_vptr_CapTableReader +
               (ulong)(local_128._reader.capTable == (CapTableReader *)0x0);
          value.super_StringPtr.content.ptr = (char *)pSVar3;
          LocatedText::Builder::setValue(&relativeName,value);
          kj::Array<char>::~Array((Array<char> *)&local_128);
          pcVar2 = "Upgrade primitive list to struct list";
          kind = COMPATIBLE;
          sStack_140 = 0x26;
          goto LAB_00169ada;
        }
        pcVar2 = "Upgrade primitive list to struct list, but bool lists can\'t be upgraded.";
      }
      sStack_140 = 0x49;
    }
    else {
      pcVar2 = "Upgrade primitive list to struct list, but it wasn\'t a list.";
      sStack_140 = 0x3d;
    }
  }
  kind = NO_CHANGE;
LAB_00169ada:
  description.content.size_ = sStack_140;
  description.content.ptr = pcVar2;
  ChangeInfo::ChangeInfo(__return_storage_ptr__,kind,description);
  return __return_storage_ptr__;
}

Assistant:

static ChangeInfo fieldUpgradeList(Declaration::Builder decl, uint& nextOrdinal,
                                   bool scopeHasUnion) {
  // Upgrades a non-struct list to a struct list.

  auto field = decl.getField();
  if (field.getDefaultValue().isValue()) {
    return { NO_CHANGE, "Upgrade primitive list to struct list, but it had a default value." };
  }

  auto type = field.getType();
  if (!type.isApplication()) {
    return { NO_CHANGE, "Upgrade primitive list to struct list, but it wasn't a list." };
  }
  auto typeParams = type.getApplication().getParams();

  auto elementType = typeParams[0].getValue();
  auto relativeName = elementType.getRelativeName();
  auto nameText = relativeName.asReader().getValue();
  if (nameText == "StructType" || nameText.endsWith("Struct")) {
    return { NO_CHANGE, "Upgrade primitive list to struct list, but it was already a struct list."};
  }
  if (nameText == "Bool") {
    return { NO_CHANGE, "Upgrade primitive list to struct list, but bool lists can't be upgraded."};
  }

  relativeName.setValue(kj::str(nameText, "Struct"));
  return { COMPATIBLE, "Upgrade primitive list to struct list" };
}